

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O0

void __thiscall
ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash
          (ThreeWiseHash<unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint maxval;
  ostream *poVar1;
  undefined8 *puVar2;
  undefined1 local_428 [8];
  CharacterHash<unsigned_int,_unsigned_char> ch;
  int i;
  int mywordsize_local;
  int myn_local;
  ThreeWiseHash<unsigned_int,_unsigned_char> *this_local;
  
  this->n = myn;
  this->wordsize = mywordsize;
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::deque(&this->ngram);
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hashers).
  super__Vector_base<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
  ::vector(&this->hashers);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,0);
  if (0x20 < (uint)this->wordsize) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Can\'t create ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->wordsize);
    poVar1 = std::operator<<(poVar1,"-bit hash values");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "abord";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  for (ch.hashvalues[0xfe] = 0; (int)ch.hashvalues[0xfe] < this->n;
      ch.hashvalues[0xfe] = ch.hashvalues[0xfe] + 1) {
    maxval = maskfnc<unsigned_int>(this->wordsize);
    CharacterHash<unsigned_int,_unsigned_char>::CharacterHash
              ((CharacterHash<unsigned_int,_unsigned_char> *)local_428,maxval);
    std::
    vector<CharacterHash<unsigned_int,_unsigned_char>,_std::allocator<CharacterHash<unsigned_int,_unsigned_char>_>_>
    ::push_back(&this->hashers,(value_type *)local_428);
  }
  return;
}

Assistant:

ThreeWiseHash(int myn, int mywordsize = 19)
      : n(myn), wordsize(mywordsize), hashers(), hasher(0) {
    if (static_cast<uint>(wordsize) > 8 * sizeof(hashvaluetype)) {
      cerr << "Can't create " << wordsize << "-bit hash values" << endl;
      throw "abord";
    }
    for (int i = 0; i < n; ++i) {
      CharacterHash<hashvaluetype, chartype> ch(
          maskfnc<hashvaluetype>(wordsize));
      hashers.push_back(ch);
    }
  }